

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O1

IOTHUB_CLIENT_RESULT
IoTHubClientCore_LL_GetLastMessageReceiveTime
          (IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle,time_t *lastMessageReceiveTime)

{
  LOGGER_LOG p_Var1;
  int iVar2;
  IOTHUB_CLIENT_RESULT IVar3;
  char *pcVar4;
  
  if (iotHubClientHandle == (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0 ||
      lastMessageReceiveTime == (time_t *)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 == (LOGGER_LOG)0x0) {
      return IOTHUB_CLIENT_INVALID_ARG;
    }
    IVar3 = IOTHUB_CLIENT_INVALID_ARG;
    iVar2 = 0x8d9;
    pcVar4 = IOTHUB_CLIENT_RESULTStringStorage[1];
  }
  else {
    if (iotHubClientHandle->lastMessageReceiveTime != -1) {
      *lastMessageReceiveTime = iotHubClientHandle->lastMessageReceiveTime;
      return IOTHUB_CLIENT_OK;
    }
    p_Var1 = xlogging_get_log_function();
    IVar3 = IOTHUB_CLIENT_INDEFINITE_TIME;
    if (p_Var1 == (LOGGER_LOG)0x0) {
      return IOTHUB_CLIENT_INDEFINITE_TIME;
    }
    iVar2 = 0x8e0;
    pcVar4 = IOTHUB_CLIENT_RESULTStringStorage[4];
  }
  (*p_Var1)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
            ,"IoTHubClientCore_LL_GetLastMessageReceiveTime",iVar2,1,"result = %s",pcVar4);
  return IVar3;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubClientCore_LL_GetLastMessageReceiveTime(IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle, time_t* lastMessageReceiveTime)
{
    IOTHUB_CLIENT_RESULT result;
    IOTHUB_CLIENT_CORE_LL_HANDLE_DATA* handleData = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA*)iotHubClientHandle;

    if (handleData == NULL || lastMessageReceiveTime == NULL)
    {
        result = IOTHUB_CLIENT_INVALID_ARG;
        LOG_ERROR_RESULT;
    }
    else
    {
        if (handleData->lastMessageReceiveTime == INDEFINITE_TIME)
        {
            result = IOTHUB_CLIENT_INDEFINITE_TIME;
            LOG_ERROR_RESULT;
        }
        else
        {
            *lastMessageReceiveTime = handleData->lastMessageReceiveTime;
            result = IOTHUB_CLIENT_OK;
        }
    }

    return result;
}